

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IForReader.cpp
# Opt level: O2

bool __thiscall IForReader::forward(IForReader *this,int base_pos,int end_pos)

{
  ostream *poVar1;
  ssize_t sVar2;
  size_t __nbytes;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  undefined1 uVar3;
  uint deep;
  int iVar4;
  ifstream *piVar5;
  allocator local_242;
  allocator local_241;
  string local_240;
  string local_220;
  string local_200;
  ISentenceReader iSentenceReader;
  ISingleCharReader iBracket1lReader;
  IBlockReader iBlockReader;
  ISingleStringReader iForStringReader;
  ISentenceReader iSentenceReader2;
  
  IBlockReader::IBlockReader
            (&iBlockReader,(this->super_IAbstractReader).m_ifs,(this->super_IAbstractReader).m_os,
             (this->super_IAbstractReader).m_deep + 1);
  ISentenceReader::ISentenceReader
            (&iSentenceReader,(this->super_IAbstractReader).m_ifs,(this->super_IAbstractReader).m_os
             ,(this->super_IAbstractReader).m_deep + 1,';');
  ISentenceReader::ISentenceReader
            (&iSentenceReader2,(this->super_IAbstractReader).m_ifs,
             (this->super_IAbstractReader).m_os,(this->super_IAbstractReader).m_deep + 1,')');
  piVar5 = (this->super_IAbstractReader).m_ifs;
  poVar1 = (this->super_IAbstractReader).m_os;
  iVar4 = (this->super_IAbstractReader).m_deep;
  std::__cxx11::string::string((string *)&local_200,"Bracket1l",(allocator *)&iForStringReader);
  ISingleCharReader::ISingleCharReader(&iBracket1lReader,piVar5,poVar1,iVar4 + 1,'(',&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  piVar5 = (this->super_IAbstractReader).m_ifs;
  poVar1 = (this->super_IAbstractReader).m_os;
  iVar4 = (this->super_IAbstractReader).m_deep;
  std::__cxx11::string::string((string *)&local_220,"for",&local_241);
  std::__cxx11::string::string((string *)&local_240,"Keyword",&local_242);
  deep = iVar4 + 1;
  __nbytes = (size_t)deep;
  ISingleStringReader::ISingleStringReader
            (&iForStringReader,piVar5,poVar1,deep,&local_220,&local_240);
  iVar4 = (int)piVar5;
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  sVar2 = IAbstractReader::read(&iForStringReader.super_IAbstractReader,iVar4,__buf,__nbytes);
  if ((char)sVar2 != '\0') {
    sVar2 = IAbstractReader::read(&iBracket1lReader.super_IAbstractReader,iVar4,__buf_00,__nbytes);
    if ((char)sVar2 != '\0') {
      sVar2 = IAbstractReader::read(&iSentenceReader.super_IAbstractReader,iVar4,__buf_01,__nbytes);
      if ((char)sVar2 != '\0') {
        sVar2 = IAbstractReader::read
                          (&iSentenceReader.super_IAbstractReader,iVar4,__buf_02,__nbytes);
        if ((char)sVar2 != '\0') {
          sVar2 = IAbstractReader::read
                            (&iSentenceReader2.super_IAbstractReader,iVar4,__buf_03,__nbytes);
          if ((char)sVar2 != '\0') {
            sVar2 = IAbstractReader::read
                              (&iBlockReader.super_IAbstractReader,iVar4,__buf_04,__nbytes);
            uVar3 = 1;
            if ((char)sVar2 == '\0') {
              sVar2 = IAbstractReader::read
                                (&iSentenceReader.super_IAbstractReader,iVar4,__buf_05,__nbytes);
              uVar3 = (undefined1)sVar2;
            }
            goto LAB_0010940f;
          }
        }
      }
    }
  }
  uVar3 = 0;
LAB_0010940f:
  ISingleStringReader::~ISingleStringReader(&iForStringReader);
  IAbstractReader::~IAbstractReader(&iBracket1lReader.super_IAbstractReader);
  ISentenceReader::~ISentenceReader(&iSentenceReader2);
  ISentenceReader::~ISentenceReader(&iSentenceReader);
  IAbstractReader::~IAbstractReader(&iBlockReader.super_IAbstractReader);
  return (bool)uVar3;
}

Assistant:

bool IForReader::forward(int base_pos, int end_pos) {
    IBlockReader iBlockReader(m_ifs,m_os,m_deep+1);
    ISentenceReader iSentenceReader(m_ifs,m_os,m_deep+1);
    ISentenceReader iSentenceReader2(m_ifs,m_os,m_deep+1,')');
    ISingleCharReader iBracket1lReader(m_ifs, m_os, m_deep + 1,'(',"Bracket1l");
    ISingleStringReader iForStringReader(m_ifs, m_os, m_deep + 1,"for");

    if(!iForStringReader.read())
        return false;
    if(!iBracket1lReader.read())
        return false;

    if(!iSentenceReader.read())
        return false;
    if(!iSentenceReader.read())
        return false;
    if(!iSentenceReader2.read())
        return false;

    return !(!iBlockReader.read() && !iSentenceReader.read());
}